

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setconsttable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQSharedState *pSVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  SQRESULT SVar7;
  
  SVar7 = -1;
  pSVar6 = SQVM::GetUp(v,-1);
  if ((pSVar6->super_SQObject)._type == OT_TABLE) {
    pSVar3 = (pSVar6->super_SQObject)._unVal.pTable;
    pSVar4 = v->_sharedstate;
    pSVar5 = (pSVar4->_consts).super_SQObject._unVal.pTable;
    (pSVar4->_consts).super_SQObject._unVal.pTable = pSVar3;
    SVar2 = (pSVar4->_consts).super_SQObject._type;
    (pSVar4->_consts).super_SQObject._type = OT_TABLE;
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SQVM::Pop(v);
    SVar7 = 0;
  }
  else {
    sq_throwerror(v,"invalid type, expected table");
  }
  return SVar7;
}

Assistant:

SQRESULT sq_setconsttable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o)) {
        _ss(v)->_consts = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type, expected table"));
}